

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_nls.c
# Opt level: O0

int cvNlsLSetup(int jbad,int *jcur,void *cvode_mem)

{
  int iVar1;
  long in_RDX;
  undefined4 *in_RSI;
  int in_EDI;
  int retval;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDX == 0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x104,"cvNlsLSetup",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_nls.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    if (in_EDI != 0) {
      *(undefined4 *)(in_RDX + 1000) = 1;
    }
    iVar1 = (**(code **)(in_RDX + 0x3f8))
                      (in_RDX,*(undefined4 *)(in_RDX + 1000),*(undefined8 *)(in_RDX + 0xd0),
                       *(undefined8 *)(in_RDX + 0xe8),in_RDX + 0x450,*(undefined8 *)(in_RDX + 0xf0),
                       *(undefined8 *)(in_RDX + 0xf8),*(undefined8 *)(in_RDX + 0x100));
    *(long *)(in_RDX + 0x388) = *(long *)(in_RDX + 0x388) + 1;
    *in_RSI = *(undefined4 *)(in_RDX + 0x450);
    *(undefined8 *)(in_RDX + 0x298) = 0x3ff0000000000000;
    *(undefined8 *)(in_RDX + 0x290) = *(undefined8 *)(in_RDX + 0x288);
    *(undefined8 *)(in_RDX + 0x2a0) = 0x3ff0000000000000;
    *(undefined8 *)(in_RDX + 0x430) = *(undefined8 *)(in_RDX + 0x358);
    if (iVar1 < 0) {
      local_4 = -6;
    }
    else if (iVar1 < 1) {
      local_4 = 0;
    }
    else {
      local_4 = 0x386;
    }
  }
  return local_4;
}

Assistant:

static int cvNlsLSetup(sunbooleantype jbad, sunbooleantype* jcur, void* cvode_mem)
{
  CVodeMem cv_mem;
  int retval;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* if the nonlinear solver marked the Jacobian as bad update convfail */
  if (jbad) { cv_mem->convfail = CV_FAIL_BAD_J; }

  /* setup the linear solver */
  retval = cv_mem->cv_lsetup(cv_mem, cv_mem->convfail, cv_mem->cv_y,
                             cv_mem->cv_ftemp, &(cv_mem->cv_jcur),
                             cv_mem->cv_vtemp1, cv_mem->cv_vtemp2,
                             cv_mem->cv_vtemp3);
  cv_mem->cv_nsetups++;

  /* update Jacobian status */
  *jcur = cv_mem->cv_jcur;

  cv_mem->cv_gamrat = ONE;
  cv_mem->cv_gammap = cv_mem->cv_gamma;
  cv_mem->cv_crate  = ONE;
  cv_mem->cv_nstlp  = cv_mem->cv_nst;

  if (retval < 0) { return (CV_LSETUP_FAIL); }
  if (retval > 0) { return (SUN_NLS_CONV_RECVR); }

  return (CV_SUCCESS);
}